

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

RecyclableObject * __thiscall Js::JavascriptProxy::GetPrototypeSpecial(JavascriptProxy *this)

{
  code *pcVar1;
  anon_class_32_4_22370477 implicitCall;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  HostScriptContext *this_00;
  RecyclableObject *pRVar7;
  RecyclableObject *obj;
  JavascriptFunction *function;
  ScriptContext *this_01;
  Var pvVar8;
  undefined4 *puVar9;
  TypeId prototypeTypeId;
  Var getPrototypeOfResult;
  JavascriptFunction *getPrototypeOfMethod;
  RecyclableObject *targetObj;
  RecyclableObject *handlerObj;
  ScriptContext *requestContext;
  ThreadContext *threadContext;
  JavascriptProxy *this_local;
  TypeId local_18;
  TypeId typeId;
  
  pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  bVar2 = ThreadContext::IsDisableImplicitCall(pTVar6);
  if (bVar2) {
    ThreadContext::AddImplicitCallFlags(pTVar6,ImplicitCall_External);
    this_local = (JavascriptProxy *)0x0;
  }
  else {
    this_00 = ThreadContext::GetPreviousHostScriptContext(pTVar6);
    pSVar5 = HostScriptContext::GetScriptContext(this_00);
    pRVar7 = MarshalHandler(this,pSVar5);
    if (pRVar7 == (RecyclableObject *)0x0) {
      bVar2 = ThreadContext::RecordImplicitException(pTVar6);
      if (bVar2) {
        pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
        JavascriptError::ThrowTypeError(pSVar5,-0x7ff5ea15,L"getPrototypeOf");
      }
      this_local = (JavascriptProxy *)0x0;
    }
    else {
      obj = MarshalTarget(this,pSVar5);
      function = GetMethodHelper(this,0x199,pSVar5);
      if (function != (JavascriptFunction *)0x0) {
        this_01 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
        bVar2 = ScriptContext::IsHeapEnumInProgress(this_01);
        if (!bVar2) {
          implicitCall.getPrototypeOfMethod = function;
          implicitCall.threadContext = pTVar6;
          implicitCall.handlerObj = pRVar7;
          implicitCall.targetObj = obj;
          pvVar8 = ThreadContext::
                   ExecuteImplicitCall<Js::JavascriptProxy::GetPrototypeSpecial()::__0>
                             (pTVar6,(RecyclableObject *)function,ImplicitCall_Accessor,implicitCall
                             );
          if (pvVar8 == (Var)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
          bVar2 = TaggedInt::Is(pvVar8);
          if (bVar2) {
            local_18 = TypeIds_FirstNumberType;
          }
          else {
            bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar8);
            if (bVar2) {
              local_18 = TypeIds_Number;
            }
            else {
              pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
              if (pRVar7 == (RecyclableObject *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar9 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar9 = 0;
              }
              local_18 = RecyclableObject::GetTypeId(pRVar7);
              if ((0x57 < (int)local_18) &&
                 (BVar3 = RecyclableObject::IsExternal(pRVar7), BVar3 == 0)) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar9 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                            "GetTypeId aValue has invalid TypeId");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar9 = 0;
              }
            }
          }
          BVar3 = Js::JavascriptOperators::IsObjectType(local_18);
          if ((BVar3 == 0) && (local_18 != TypeIds_Null)) {
            JavascriptError::ThrowTypeError(pSVar5,-0x7ff5ea14,L"getPrototypeOf");
          }
          iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x33])();
          if (iVar4 == 0) {
            pRVar7 = RecyclableObject::GetPrototype(obj);
            bVar2 = JavascriptConversion::SameValue(pvVar8,pRVar7);
            if (!bVar2) {
              JavascriptError::ThrowTypeError(pSVar5,-0x7ff5ea14,L"getPrototypeOf");
            }
          }
          pRVar7 = VarTo<Js::RecyclableObject>(pvVar8);
          return pRVar7;
        }
      }
      pvVar8 = JavascriptObject::GetPrototypeOf(obj,pSVar5);
      this_local = (JavascriptProxy *)VarTo<Js::RecyclableObject>(pvVar8);
    }
  }
  return (RecyclableObject *)this_local;
}

Assistant:

RecyclableObject* JavascriptProxy::GetPrototypeSpecial()
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return nullptr;
        }

        // Caller does not pass requestContext. Retrieve from host scriptContext stack.
        ScriptContext* requestContext =
            threadContext->GetPreviousHostScriptContext()->GetScriptContext();

        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);
        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return nullptr;
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u("getPrototypeOf"));
        }

        Js::RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        JavascriptFunction* getPrototypeOfMethod = GetMethodHelper(PropertyIds::getPrototypeOf, requestContext);

        if (nullptr == getPrototypeOfMethod || GetScriptContext()->IsHeapEnumInProgress())
        {
            return VarTo<RecyclableObject>(JavascriptObject::GetPrototypeOf(targetObj, requestContext));
        }

        Var getPrototypeOfResult = threadContext->ExecuteImplicitCall(getPrototypeOfMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, getPrototypeOfMethod, CallInfo(CallFlags_Value, 2), handlerObj, targetObj);
        });

        TypeId prototypeTypeId = JavascriptOperators::GetTypeId(getPrototypeOfResult);
        if (!JavascriptOperators::IsObjectType(prototypeTypeId) && prototypeTypeId != TypeIds_Null)
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getPrototypeOf"));
        }
        if (!targetObj->IsExtensible() && !JavascriptConversion::SameValue(getPrototypeOfResult, targetObj->GetPrototype()))
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getPrototypeOf"));
        }
        return VarTo<RecyclableObject>(getPrototypeOfResult);
    }